

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O1

int __thiscall QToolButtonPrivate::init(QToolButtonPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  void **ppvVar1;
  int iVar2;
  long lVar3;
  undefined4 *puVar4;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  Connection local_68;
  Connection local_60;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->defaultAction = (QAction *)0x0;
  this_00 = *(QWidget **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  lVar3 = QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  this->arrowType = NoArrow;
  this->toolButtonStyle = ToolButtonIconOnly;
  this->popupMode = DelayedPopup;
  this->field_0x2ec = (lVar3 != 0) << 3 | this->field_0x2ec & 0xf0;
  *(undefined4 *)&(this->super_QAbstractButtonPrivate).field_0x2b4 = 0;
  QWidget::setFocusPolicy(this_00,TabFocus);
  QWidget::setSizePolicy(this_00,(QSizePolicy)0xe000000);
  local_48 = QAbstractButton::pressed;
  local_40 = 0;
  local_58 = onButtonPressed;
  local_50 = (ImplFn)0x0;
  ppvVar1 = *(void ***)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QToolButtonPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = onButtonPressed;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_60,(void **)this_00,(QObject *)&local_48,ppvVar1,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_60);
  local_48 = QAbstractButton::released;
  local_40 = 0;
  local_58 = onButtonReleased;
  local_50 = (ImplFn)0x0;
  ppvVar1 = *(void ***)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QToolButtonPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = onButtonReleased;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_68,(void **)this_00,(QObject *)&local_48,ppvVar1,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_68);
  QWidgetPrivate::setLayoutItemMargins
            ((QWidgetPrivate *)this,SE_ToolButtonLayoutItem,(QStyleOption *)0x0);
  pQVar5 = QWidget::style(this_00);
  iVar2 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x34,0,this_00,0);
  this->delay = iVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QToolButtonPrivate::init()
{
    Q_Q(QToolButton);
    defaultAction = nullptr;
#if QT_CONFIG(toolbar)
    if (qobject_cast<QToolBar*>(parent))
        autoRaise = true;
    else
#endif
        autoRaise = false;
    arrowType = Qt::NoArrow;
    menuButtonDown = false;
    popupMode = QToolButton::DelayedPopup;
    buttonPressed = QToolButtonPrivate::NoButtonPressed;

    toolButtonStyle = Qt::ToolButtonIconOnly;
    hoverControl = QStyle::SC_None;

    q->setFocusPolicy(Qt::TabFocus);
    q->setSizePolicy(QSizePolicy(QSizePolicy::Fixed, QSizePolicy::Fixed,
                                 QSizePolicy::ToolButton));

#if QT_CONFIG(menu)
    QObjectPrivate::connect(q, &QAbstractButton::pressed,
                            this, &QToolButtonPrivate::onButtonPressed);
    QObjectPrivate::connect(q, &QAbstractButton::released,
                            this, &QToolButtonPrivate::onButtonReleased);
#endif

    setLayoutItemMargins(QStyle::SE_ToolButtonLayoutItem);
    delay = q->style()->styleHint(QStyle::SH_ToolButton_PopupDelay, nullptr, q);
}